

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

Vec_Int_t * Vec_IntInvert(Vec_Int_t *p,int Fill)

{
  int iVar1;
  Vec_Int_t *p_00;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint nCapMin;
  int iVar5;
  
  p_00 = Vec_IntAlloc(0);
  if ((long)p->nSize != 0) {
    iVar5 = *p->pArray;
    for (lVar4 = 1; lVar4 < p->nSize; lVar4 = lVar4 + 1) {
      iVar1 = p->pArray[lVar4];
      if (iVar5 <= iVar1) {
        iVar5 = iVar1;
      }
    }
    nCapMin = iVar5 + 1;
    Vec_IntGrow(p_00,nCapMin);
    uVar2 = 0;
    uVar3 = 0;
    if (0 < (int)nCapMin) {
      uVar3 = (ulong)nCapMin;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      p_00->pArray[uVar2] = -1;
    }
    p_00->nSize = nCapMin;
    for (iVar5 = 0; iVar5 < p->nSize; iVar5 = iVar5 + 1) {
      iVar1 = Vec_IntEntry(p,iVar5);
      if (iVar1 != -1) {
        Vec_IntWriteEntry(p_00,iVar1,iVar5);
      }
    }
  }
  return p_00;
}

Assistant:

static inline Vec_Int_t * Vec_IntInvert( Vec_Int_t * p, int Fill ) 
{
    int Entry, i;
    Vec_Int_t * vRes = Vec_IntAlloc( 0 );
    if ( Vec_IntSize(p) == 0 )
        return vRes;
    Vec_IntFill( vRes, Vec_IntFindMax(p) + 1, Fill );
    Vec_IntForEachEntry( p, Entry, i )
        if ( Entry != Fill )
            Vec_IntWriteEntry( vRes, Entry, i );
    return vRes;
}